

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O1

void __thiscall
CUI::DoScrollbarOption
          (CUI *this,void *pID,int *pOption,CUIRect *pRect,char *pStr,int Min,int Max,
          IScrollbarScale *pScale,bool Infinite)

{
  uint uVar1;
  uint uVar2;
  long in_FS_OFFSET;
  float FontSize;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float Current;
  float fVar3;
  CUIRect ScrollBar;
  CUIRect Label;
  char aBuf [128];
  char aBufMax [128];
  CUIRect local_158;
  vec4 local_148;
  char local_138 [128];
  char local_b8 [128];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = *pOption;
  uVar1 = uVar2;
  if (uVar2 == 0) {
    uVar1 = Max + 1U;
  }
  if (Infinite) {
    Max = Max + 1U;
    uVar2 = uVar1;
  }
  str_format(local_b8,0x80,"%s: %i",pStr,(ulong)(uint)Max);
  if (Infinite && uVar2 == Max) {
    str_format(local_138,0x80,anon_var_dwarf_1397fe,pStr);
  }
  else {
    str_format(local_138,0x80,"%s: %i",pStr,(ulong)uVar2);
  }
  FontSize = pRect->h * 0.8 * 0.8;
  (*(this->m_pTextRender->super_IInterface)._vptr_IInterface[6])
            (this->m_pTextRender,local_138,0xffffffff);
  (*(this->m_pTextRender->super_IInterface)._vptr_IInterface[6])
            (FontSize,this->m_pTextRender,local_b8,0xffffffff);
  fVar3 = extraout_XMM0_Da;
  if (extraout_XMM0_Da <= extraout_XMM0_Da_00) {
    fVar3 = extraout_XMM0_Da_00;
  }
  local_148.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x0;
  local_148.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x0;
  local_148.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x0;
  local_148.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3e800000;
  CUIRect::Draw(pRect,&local_148,5.0,0xf);
  CUIRect::VSplitLeft(pRect,pRect->h + 10.0 + fVar3,(CUIRect *)&local_148,&local_158);
  CUIRect::VSplitLeft((CUIRect *)&local_148,local_148.field_3.w + 5.0,(CUIRect *)0x0,
                      (CUIRect *)&local_148);
  DoLabel(this,(CUIRect *)&local_148,local_138,FontSize,4,-1.0,true);
  CUIRect::VMargin(&local_158,4.0,&local_158);
  (**pScale->_vptr_IScrollbarScale)
            (pScale,(ulong)uVar2,(ulong)((uint)Infinite + Min),(ulong)(uint)Max);
  DoScrollbarH(this,pID,&local_158,Current);
  uVar1 = (*pScale->_vptr_IScrollbarScale[1])(pScale,(ulong)((uint)Infinite + Min),(ulong)(uint)Max)
  ;
  uVar2 = 0;
  if (!Infinite) {
    uVar2 = uVar1;
  }
  if (uVar1 != Max) {
    uVar2 = uVar1;
  }
  *pOption = uVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CUI::DoScrollbarOption(const void *pID, int *pOption, const CUIRect *pRect, const char *pStr, int Min, int Max, const IScrollbarScale *pScale, bool Infinite)
{
	int Value = *pOption;
	if(Infinite)
	{
		Min += 1;
		Max += 1;
		if(Value == 0)
			Value = Max;
	}

	char aBufMax[128];
	str_format(aBufMax, sizeof(aBufMax), "%s: %i", pStr, Max);
	char aBuf[128];
	if(!Infinite || Value != Max)
		str_format(aBuf, sizeof(aBuf), "%s: %i", pStr, Value);
	else
		str_format(aBuf, sizeof(aBuf), "%s: \xe2\x88\x9e", pStr);

	float FontSize = pRect->h*CUI::ms_FontmodHeight*0.8f;
	float VSplitVal = maximum(TextRender()->TextWidth(FontSize, aBuf, -1), TextRender()->TextWidth(FontSize, aBufMax, -1));

	pRect->Draw(vec4(0.0f, 0.0f, 0.0f, 0.25f));

	CUIRect Label, ScrollBar;
	pRect->VSplitLeft(pRect->h+10.0f+VSplitVal, &Label, &ScrollBar);
	Label.VSplitLeft(Label.h+5.0f, 0, &Label);
	DoLabel(&Label, aBuf, FontSize, TEXTALIGN_ML);

	ScrollBar.VMargin(4.0f, &ScrollBar);
	Value = pScale->ToAbsolute(DoScrollbarH(pID, &ScrollBar, pScale->ToRelative(Value, Min, Max)), Min, Max);
	if(Infinite && Value == Max)
		Value = 0;

	*pOption = Value;
}